

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int jsonParseValue(JsonParse *pParse,u32 i)

{
  u8 *puVar1;
  byte bVar2;
  char *pcVar3;
  bool bVar4;
  byte bVar5;
  ushort uVar6;
  int iVar7;
  char cVar8;
  ulong uVar9;
  uint uVar10;
  u32 uVar11;
  u8 uVar12;
  int iVar13;
  byte bVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  char *__s1;
  ulong uVar14;
  
  pcVar3 = pParse->zJson;
  uVar9 = (ulong)i;
  do {
    uVar14 = uVar9;
    iVar13 = (int)uVar14;
    bVar15 = pcVar3[uVar14];
    uVar17 = iVar13 + 1;
    uVar9 = (ulong)uVar17;
  } while (""[bVar15] != '\0');
  __s1 = pcVar3 + uVar14;
  if (bVar15 < 0x6e) {
    if (bVar15 == 0x22) {
      bVar15 = pcVar3[uVar17];
      if (bVar15 < 0x20) {
        return -1;
      }
      uVar12 = '\0';
      uVar9 = (ulong)uVar17;
      do {
        iVar13 = (int)uVar14;
        if (bVar15 == 0x5c) {
          uVar14 = (ulong)(iVar13 + 2);
          bVar15 = pcVar3[uVar14];
          uVar12 = '\x02';
          if ((0x37 < bVar15 - 0x2f) ||
             ((0x88200000000001U >> ((ulong)(bVar15 - 0x2f) & 0x3f) & 1) == 0)) {
            switch(bVar15) {
            case 0x6e:
            case 0x72:
            case 0x74:
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
              return -1;
            case 0x75:
              lVar16 = 0;
              do {
                if ((""[(byte)pcVar3[lVar16 + uVar14 + 1]] & 8) == 0) {
                  return -1;
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 != 4);
              break;
            default:
              if (bVar15 != 0x22) {
                return -1;
              }
            }
          }
        }
        else {
          uVar14 = uVar9;
          if (bVar15 == 0x22) {
            jsonParseAddNode(pParse,5,(iVar13 - uVar17) + 3,__s1);
            if (pParse->oom == '\0') {
              pParse->aNode[pParse->nNode - 1].jnFlags = uVar12;
              return iVar13 + 2;
            }
            return iVar13 + 2;
          }
        }
        uVar9 = (ulong)((int)uVar14 + 1);
        bVar15 = pcVar3[uVar9];
      } while (0x1f < bVar15);
      return -1;
    }
    if (bVar15 == 0x5b) {
      uVar17 = jsonParseAddNode(pParse,6,0,(char *)0x0);
      if ((int)uVar17 < 0) {
        return -1;
      }
      pParse->aNode[uVar17].u.zJContent = (char *)0x0;
      while( true ) {
        do {
          iVar13 = (int)uVar14;
          uVar18 = iVar13 + 1;
          uVar14 = (ulong)uVar18;
        } while (""[(byte)pcVar3[uVar14]] != '\0');
        uVar6 = pParse->iDepth + 1;
        pParse->iDepth = uVar6;
        if (2000 < uVar6) {
          return -1;
        }
        uVar18 = jsonParseValue(pParse,uVar18);
        pParse->iDepth = pParse->iDepth - 1;
        if ((int)uVar18 < 0) break;
        do {
          uVar10 = uVar18;
          bVar15 = pcVar3[uVar10];
          uVar18 = uVar10 + 1;
        } while (""[bVar15] != '\0');
        uVar14 = (ulong)uVar10;
        if (bVar15 != 0x2c) {
          if (bVar15 == 0x5d) {
            pParse->aNode[uVar17].n = ~uVar17 + pParse->nNode;
            return uVar10 + 1;
          }
          return -1;
        }
      }
      if (uVar18 != 0xfffffffd) {
        return -1;
      }
      if (pParse->nNode == uVar17 + 1) {
        return iVar13 + 2;
      }
      return -1;
    }
    if (((bVar15 == 0x66) && (iVar7 = strncmp(__s1,"false",5), iVar7 == 0)) &&
       (uVar18 = iVar13 + 5, (""[(byte)pcVar3[uVar18]] & 6) == 0)) {
      uVar11 = 2;
LAB_001be79f:
      jsonParseAddNode(pParse,uVar11,0,(char *)0x0);
      return uVar18;
    }
  }
  else if (bVar15 == 0x6e) {
    iVar7 = strncmp(__s1,"null",4);
    if ((iVar7 == 0) && (uVar18 = iVar13 + 4, (""[(byte)pcVar3[uVar18]] & 6) == 0)) {
      uVar11 = 0;
      goto LAB_001be79f;
    }
  }
  else if (bVar15 == 0x74) {
    iVar7 = strncmp(__s1,"true",4);
    if ((iVar7 == 0) && (uVar18 = iVar13 + 4, (""[(byte)pcVar3[uVar18]] & 6) == 0)) {
      uVar11 = 1;
      goto LAB_001be79f;
    }
  }
  else if (bVar15 == 0x7b) {
    uVar17 = jsonParseAddNode(pParse,7,0,(char *)0x0);
    if ((int)uVar17 < 0) {
      return -1;
    }
    do {
      do {
        iVar13 = (int)uVar14;
        uVar18 = iVar13 + 1;
        uVar14 = (ulong)uVar18;
      } while (""[(byte)pcVar3[uVar14]] != '\0');
      uVar6 = pParse->iDepth + 1;
      pParse->iDepth = uVar6;
      if (2000 < uVar6) {
        return -1;
      }
      uVar18 = jsonParseValue(pParse,uVar18);
      if ((int)uVar18 < 0) {
        pParse->iDepth = pParse->iDepth - 1;
        if (uVar18 != 0xfffffffe) {
          return -1;
        }
        if (pParse->nNode == uVar17 + 1) {
          return iVar13 + 2;
        }
        return -1;
      }
      if (pParse->oom != '\0') {
        return -1;
      }
      uVar10 = pParse->nNode - 1;
      if (pParse->aNode[uVar10].eType != '\x05') {
        return -1;
      }
      puVar1 = &pParse->aNode[uVar10].jnFlags;
      *puVar1 = *puVar1 | 0x40;
      do {
        uVar9 = (ulong)uVar18;
        uVar18 = uVar18 + 1;
      } while (""[(byte)pcVar3[uVar9]] != '\0');
      if (pcVar3[uVar9] != 0x3a) {
        return -1;
      }
      uVar18 = jsonParseValue(pParse,uVar18);
      pParse->iDepth = pParse->iDepth - 1;
      if ((int)uVar18 < 0) {
        return -1;
      }
      do {
        uVar10 = uVar18;
        bVar15 = pcVar3[uVar10];
        uVar18 = uVar10 + 1;
      } while (""[bVar15] != '\0');
      uVar14 = (ulong)uVar10;
    } while (bVar15 == 0x2c);
    if (bVar15 == 0x7d) {
      pParse->aNode[uVar17].n = ~uVar17 + pParse->nNode;
      return uVar10 + 1;
    }
    return -1;
  }
  if (bVar15 == 0x2d || (byte)(bVar15 - 0x30) < 10) {
    if (((bVar15 < 0x31) && (pcVar3[((bVar15 == 0x2d) + uVar17) - 1] == '0')) &&
       ((byte)(pcVar3[(bVar15 == 0x2d) + uVar17] - 0x30U) < 10)) {
      return -1;
    }
    bVar15 = 1;
    bVar5 = bVar15;
    do {
      while( true ) {
        uVar11 = ((int)uVar14 - uVar17) + 1;
        do {
          uVar9 = uVar14;
          iVar13 = (int)uVar9;
          uVar14 = (ulong)(iVar13 + 1U);
          bVar2 = pcVar3[uVar14];
          uVar11 = uVar11 + 1;
        } while ((byte)(bVar2 - 0x30) < 10);
        if (bVar2 == 0x2e) break;
        if ((bVar2 & 0xdf) != 0x45) {
          if ('/' < pcVar3[uVar9]) {
            jsonParseAddNode(pParse,4 - bVar15,uVar11,__s1);
            return iVar13 + 1U;
          }
          return -1;
        }
        if ((~bVar5 & 1) != 0 || pcVar3[uVar9] < '0') {
          return -1;
        }
        cVar8 = pcVar3[iVar13 + 2];
        if ((cVar8 == '-') || (cVar8 == '+')) {
          cVar8 = pcVar3[iVar13 + 3];
          uVar14 = (ulong)(iVar13 + 2);
        }
        bVar15 = 0;
        bVar5 = bVar15;
        if ((byte)(cVar8 - 0x3aU) < 0xf6) {
          return -1;
        }
      }
      bVar4 = (bool)(pcVar3[uVar9] != '-' & bVar15);
      bVar15 = 0;
    } while (bVar4);
  }
  else {
    if (bVar15 == 0) {
      return 0;
    }
    if (bVar15 == 0x7d) {
      return -2;
    }
    if (bVar15 == 0x5d) {
      return -3;
    }
  }
  return -1;
}

Assistant:

static int jsonParseValue(JsonParse *pParse, u32 i){
  char c;
  u32 j;
  int iThis;
  int x;
  JsonNode *pNode;
  const char *z = pParse->zJson;
  while( fast_isspace(z[i]) ){ i++; }
  if( (c = z[i])=='{' ){
    /* Parse object */
    iThis = jsonParseAddNode(pParse, JSON_OBJECT, 0, 0);
    if( iThis<0 ) return -1;
    for(j=i+1;;j++){
      while( fast_isspace(z[j]) ){ j++; }
      if( ++pParse->iDepth > JSON_MAX_DEPTH ) return -1;
      x = jsonParseValue(pParse, j);
      if( x<0 ){
        pParse->iDepth--;
        if( x==(-2) && pParse->nNode==(u32)iThis+1 ) return j+1;
        return -1;
      }
      if( pParse->oom ) return -1;
      pNode = &pParse->aNode[pParse->nNode-1];
      if( pNode->eType!=JSON_STRING ) return -1;
      pNode->jnFlags |= JNODE_LABEL;
      j = x;
      while( fast_isspace(z[j]) ){ j++; }
      if( z[j]!=':' ) return -1;
      j++;
      x = jsonParseValue(pParse, j);
      pParse->iDepth--;
      if( x<0 ) return -1;
      j = x;
      while( fast_isspace(z[j]) ){ j++; }
      c = z[j];
      if( c==',' ) continue;
      if( c!='}' ) return -1;
      break;
    }
    pParse->aNode[iThis].n = pParse->nNode - (u32)iThis - 1;
    return j+1;
  }else if( c=='[' ){
    /* Parse array */
    iThis = jsonParseAddNode(pParse, JSON_ARRAY, 0, 0);
    if( iThis<0 ) return -1;
    memset(&pParse->aNode[iThis].u, 0, sizeof(pParse->aNode[iThis].u));
    for(j=i+1;;j++){
      while( fast_isspace(z[j]) ){ j++; }
      if( ++pParse->iDepth > JSON_MAX_DEPTH ) return -1;
      x = jsonParseValue(pParse, j);
      pParse->iDepth--;
      if( x<0 ){
        if( x==(-3) && pParse->nNode==(u32)iThis+1 ) return j+1;
        return -1;
      }
      j = x;
      while( fast_isspace(z[j]) ){ j++; }
      c = z[j];
      if( c==',' ) continue;
      if( c!=']' ) return -1;
      break;
    }
    pParse->aNode[iThis].n = pParse->nNode - (u32)iThis - 1;
    return j+1;
  }else if( c=='"' ){
    /* Parse string */
    u8 jnFlags = 0;
    j = i+1;
    for(;;){
      c = z[j];
      if( (c & ~0x1f)==0 ){
        /* Control characters are not allowed in strings */
        return -1;
      }
      if( c=='\\' ){
        c = z[++j];
        if( c=='"' || c=='\\' || c=='/' || c=='b' || c=='f'
           || c=='n' || c=='r' || c=='t'
           || (c=='u' && jsonIs4Hex(z+j+1)) ){
          jnFlags = JNODE_ESCAPE;
        }else{
          return -1;
        }
      }else if( c=='"' ){
        break;
      }
      j++;
    }
    jsonParseAddNode(pParse, JSON_STRING, j+1-i, &z[i]);
    if( !pParse->oom ) pParse->aNode[pParse->nNode-1].jnFlags = jnFlags;
    return j+1;
  }else if( c=='n'
         && strncmp(z+i,"null",4)==0
         && !sqlite3Isalnum(z[i+4]) ){
    jsonParseAddNode(pParse, JSON_NULL, 0, 0);
    return i+4;
  }else if( c=='t'
         && strncmp(z+i,"true",4)==0
         && !sqlite3Isalnum(z[i+4]) ){
    jsonParseAddNode(pParse, JSON_TRUE, 0, 0);
    return i+4;
  }else if( c=='f'
         && strncmp(z+i,"false",5)==0
         && !sqlite3Isalnum(z[i+5]) ){
    jsonParseAddNode(pParse, JSON_FALSE, 0, 0);
    return i+5;
  }else if( c=='-' || (c>='0' && c<='9') ){
    /* Parse number */
    u8 seenDP = 0;
    u8 seenE = 0;
    assert( '-' < '0' );
    if( c<='0' ){
      j = c=='-' ? i+1 : i;
      if( z[j]=='0' && z[j+1]>='0' && z[j+1]<='9' ) return -1;
    }
    j = i+1;
    for(;; j++){
      c = z[j];
      if( c>='0' && c<='9' ) continue;
      if( c=='.' ){
        if( z[j-1]=='-' ) return -1;
        if( seenDP ) return -1;
        seenDP = 1;
        continue;
      }
      if( c=='e' || c=='E' ){
        if( z[j-1]<'0' ) return -1;
        if( seenE ) return -1;
        seenDP = seenE = 1;
        c = z[j+1];
        if( c=='+' || c=='-' ){
          j++;
          c = z[j+1];
        }
        if( c<'0' || c>'9' ) return -1;
        continue;
      }
      break;
    }
    if( z[j-1]<'0' ) return -1;
    jsonParseAddNode(pParse, seenDP ? JSON_REAL : JSON_INT,
                        j - i, &z[i]);
    return j;
  }else if( c=='}' ){
    return -2;  /* End of {...} */
  }else if( c==']' ){
    return -3;  /* End of [...] */
  }else if( c==0 ){
    return 0;   /* End of file */
  }else{
    return -1;  /* Syntax error */
  }
}